

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O0

int default_printer(xmlDocPtr doc)

{
  FILE *pFVar1;
  undefined8 uVar2;
  undefined8 in_RDI;
  xmlOutputBufferPtr outBuf;
  xml_suite_context *ctx;
  
  pFVar1 = context_stack[context_stack_p + -1].outFile;
  uVar2 = xmlGetCharEncodingHandler(1);
  uVar2 = xmlOutputBufferCreateFile(pFVar1,uVar2);
  xmlSaveFormatFileTo(uVar2,in_RDI,"UTF-8",1);
  return 0;
}

Assistant:

static int default_printer(xmlDocPtr doc)
{
    struct xml_suite_context *ctx = &context_stack[context_stack_p-1];
    xmlOutputBufferPtr outBuf
        = xmlOutputBufferCreateFile(ctx->outFile,
                                    xmlGetCharEncodingHandler(XML_CHAR_ENCODING_UTF8));
    xmlSaveFormatFileTo(outBuf, doc, "UTF-8", 1);

    return 0;
}